

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_page_remove(PageDesc *pd,TranslationBlock_conflict *tb)

{
  uint uVar1;
  TranslationBlock_conflict *pTVar2;
  
  while( true ) {
    pTVar2 = (TranslationBlock_conflict *)(pd->first_tb & 0xfffffffffffffffe);
    if (pTVar2 == (TranslationBlock_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                 ,0x586,(char *)0x0);
    }
    uVar1 = (uint)pd->first_tb & 1;
    if (pTVar2 == tb) break;
    pd = (PageDesc *)(pTVar2->page_next + uVar1);
  }
  pd->first_tb = pTVar2->page_next[uVar1];
  return;
}

Assistant:

static inline void tb_page_remove(PageDesc *pd, TranslationBlock *tb)
{
    TranslationBlock *tb1;
    uintptr_t *pprev;
    unsigned int n1;

    assert_page_locked(pd);
    pprev = &pd->first_tb;
    PAGE_FOR_EACH_TB(pd, tb1, n1) {
        if (tb1 == tb) {
            *pprev = tb1->page_next[n1];
            return;
        }
        pprev = &tb1->page_next[n1];
    }
    g_assert_not_reached();
}